

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  reference pvVar4;
  undefined1 local_e8 [4];
  int err;
  VEC_INFO vec_info;
  int ret;
  string local_c0 [55];
  allocator<char> local_89;
  string local_88 [36];
  int local_64;
  undefined1 local_60 [4];
  int c;
  string strKlgFileName;
  string strAssociation_Path;
  int option_count;
  char **argv_local;
  int argc_local;
  
  strAssociation_Path.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)(strKlgFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  local_64 = 0;
  while (local_64 = getopt(argc,argv,"worts"), local_64 != -1) {
    switch(local_64) {
    case 0x6f:
      strAssociation_Path.field_2._12_4_ = strAssociation_Path.field_2._12_4_ + 1;
      pcVar2 = argv[_optind];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,pcVar2,(allocator<char> *)((long)&ret + 3));
      std::__cxx11::string::operator=((string *)local_60,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ret + 3));
      break;
    default:
      break;
    case 0x72:
      strAssociation_Path.field_2._12_4_ = strAssociation_Path.field_2._12_4_ + 1;
      g_bFlag_reverse = true;
      break;
    case 0x73:
      strAssociation_Path.field_2._12_4_ = strAssociation_Path.field_2._12_4_ + 1;
      __isoc99_sscanf(argv[_optind],"%lf",&g_dScale);
      break;
    case 0x74:
      strAssociation_Path.field_2._12_4_ = strAssociation_Path.field_2._12_4_ + 1;
      g_bFlag_TUM = true;
      break;
    case 0x77:
      strAssociation_Path.field_2._12_4_ = strAssociation_Path.field_2._12_4_ + 1;
      pcVar2 = argv[_optind];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_88,pcVar2,&local_89);
      std::__cxx11::string::operator=((string *)&strWorkingDir_abi_cxx11_,local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator(&local_89);
    }
  }
  if ((int)strAssociation_Path.field_2._12_4_ < 2) {
    fprintf(_stderr,
            "Usage: ./pngtoklg -w (working directory) -o (klg file name)\n\n-w working directory\n-o output klg filename\n-t TUM format\n-s Scale factor in floating point ex.  \'5000\'\nFor more scale factor detail, please reference: \nhttp://vision.in.tum.de/data/datasets/rgbd-dataset/file_formats#intrinsic_camera_calibration_of_the_kinect\nExample: ./pngtoklg -w ../livingroom_kt0_rs -o liv.klg\nassociations.txt should be in (depth_time)(depth_file)(rgb_time)(rgb_file) order\n"
           );
    argv_local._4_4_ = -1;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    vec_info.
    super__Vector_base<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = chdir(pcVar2);
    if (vec_info.
        super__Vector_base<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      fprintf(_stderr,"\x1b[0;32;31mdataset path not exist\x1b[m");
    }
    pcVar2 = getcwd((char *)0x0,0);
    printf("\nCurrent working directory:\n\t%s\n",pcVar2);
    std::__cxx11::string::operator=
              ((string *)(strKlgFileName.field_2._M_local_buf + 8),
               (string *)&strWorkingDir_abi_cxx11_);
    std::__cxx11::string::length();
    pcVar2 = (char *)std::__cxx11::string::operator[](0x10e288);
    if (*pcVar2 != '/') {
      std::__cxx11::string::operator+=((string *)(strKlgFileName.field_2._M_local_buf + 8),'/');
    }
    std::__cxx11::string::operator+=
              ((string *)(strKlgFileName.field_2._M_local_buf + 8),"associations.txt");
    std::
    vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::vector((vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_e8);
    iVar1 = parseInfoFile((string *)((long)&strKlgFileName.field_2 + 8),
                          (vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_e8);
    if (iVar1 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Depth: ");
      pvVar4 = std::
               vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::back((vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)local_e8);
      poVar3 = std::operator<<(poVar3,(string *)&pvVar4->second);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"RGB: ");
      pvVar4 = std::
               vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::back((vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)local_e8);
      poVar3 = std::operator<<(poVar3,(string *)&(pvVar4->second).second);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"scale: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,g_dScale);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      convertToKlg((VEC_INFO *)local_e8,(string *)local_60);
      std::operator<<((ostream *)&std::cout,"Conversion complete!\n");
      argv_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"\x1b[0;32;31mFail to find associations.txt under working directory!\n\x1b[m")
      ;
      argv_local._4_4_ = -1;
    }
    std::
    vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector((vector<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_e8);
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(strKlgFileName.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    int option_count = 0;
    std::string strAssociation_Path;
    std::string strKlgFileName;

    int c = 0;
    while((c = getopt(argc, argv, "worts")) != -1)
    {
        switch(c)
        {
            case 'w'://Dataset directory root path
                option_count++;
                strWorkingDir = std::string(argv[optind]);
                break;
            case 'o'://klg filename
                option_count++;
                strKlgFileName = std::string(argv[optind]);
                break;
            case 'r'://associations.txt is in reverse order (rgb)(depth)
                option_count++;
                g_bFlag_reverse = true;

                break;
            case 't'://TUM format
                option_count++;
                g_bFlag_TUM = true;
                break;
            case 's'://TUM format
                option_count++;
                sscanf(argv[optind], "%lf", &g_dScale);
                break;
            default:
                break;
        }
    }
    if(option_count < 2)
    {
        fprintf(stderr, 
            "Usage: ./pngtoklg -w (working directory) -o (klg file name)\n"    
            "\n"
            "-w working directory\n"
            "-o output klg filename\n"
            "-t TUM format\n"
            "-s Scale factor in floating point ex.  '5000'\n"
            "For more scale factor detail, please reference: \nhttp://vision.in.tum.de/data/datasets/rgbd-dataset/file_formats#intrinsic_camera_calibration_of_the_kinect\n"
            "Example: ./pngtoklg -w ../livingroom_kt0_rs -o liv.klg\n"
            "associations.txt should be in (depth_time)(depth_file)(rgb_time)(rgb_file) order\n");
        return -1;
    }



    /// Change working directory
    int ret = chdir(strWorkingDir.c_str());
    if(ret != 0) 
    {
        fprintf(stderr, RED "dataset path not exist" NONE);
    }
    printf("\nCurrent working directory:\n\t%s\n", getcwd(NULL, 0));


    strAssociation_Path = strWorkingDir;
    if(strWorkingDir[strWorkingDir.length() - 1] != '/')
    {
        strAssociation_Path += '/';
    }
    strAssociation_Path += "associations.txt";
    
    /// Parse files
    // (timestamp, (depth path, rgb path) )
    VEC_INFO vec_info;


    int err = parseInfoFile(
                strAssociation_Path, 
                vec_info);
    if(err != 0)
    {
        fprintf(stderr, 
            RED "Fail to find associations.txt under working directory!\n" NONE); 
        return -1;
    }

    std::cout << "Depth: " << vec_info.back().second.first << std::endl;
    std::cout << "RGB: " << vec_info.back().second.second << std::endl;
    std::cout << "scale: " << g_dScale << std::endl;

    convertToKlg(vec_info, strKlgFileName);

    std::cout << "Conversion complete!\n";
    return 0;
}